

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O3

bool __thiscall
tinyusdz::ascii::AsciiParser::ParseBasicTypeArray<tinyusdz::Path>
          (AsciiParser *this,vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *result)

{
  pointer pPVar1;
  pointer pPVar2;
  bool bVar3;
  pointer this_00;
  char c;
  char local_29;
  
  bVar3 = SkipWhitespace(this);
  if (((bVar3) && (bVar3 = Expect(this,'['), bVar3)) &&
     (bVar3 = SkipCommentAndWhitespaceAndNewline(this,true), bVar3)) {
    bVar3 = Char1(this,&local_29);
    if (!bVar3) {
      return bVar3;
    }
    if (local_29 == ']') {
      pPVar1 = (result->super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>)._M_impl
               .super__Vector_impl_data._M_start;
      pPVar2 = (result->super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>)._M_impl
               .super__Vector_impl_data._M_finish;
      this_00 = pPVar1;
      if (pPVar2 == pPVar1) {
        return bVar3;
      }
      do {
        Path::~Path(this_00);
        this_00 = this_00 + 1;
      } while (this_00 != pPVar2);
      (result->super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>)._M_impl.
      super__Vector_impl_data._M_finish = pPVar1;
      return bVar3;
    }
    Rewind(this,1);
    bVar3 = SepBy1BasicType<tinyusdz::Path>(this,',',']',result);
    if ((bVar3) && (bVar3 = SkipCommentAndWhitespaceAndNewline(this,true), bVar3)) {
      bVar3 = Expect(this,']');
      return bVar3;
    }
  }
  return false;
}

Assistant:

bool AsciiParser::ParseBasicTypeArray(std::vector<Path> *result) {
  if (!SkipWhitespace()) {
    return false;
  }

  if (!Expect('[')) {
    return false;
  }

  if (!SkipCommentAndWhitespaceAndNewline()) {
    return false;
  }

  // Empty array?
  {
    char c;
    if (!Char1(&c)) {
      return false;
    }

    if (c == ']') {
      result->clear();
      return true;
    }

    Rewind(1);
  }

  if (!SepBy1BasicType(',', ']', result)) {
    return false;
  }

  if (!SkipCommentAndWhitespaceAndNewline()) {
    return false;
  }

  if (!Expect(']')) {
    return false;
  }

  return true;
}